

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::
padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<unsigned_int,fmt::v6::basic_format_specs<wchar_t>>::dec_writer>
::operator()(padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<unsigned_int,fmt::v6::basic_format_specs<wchar_t>>::dec_writer>
             *this,wchar_t **it)

{
  wchar_t wVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  wchar_t *pwVar6;
  wchar_t *pwVar7;
  ulong uVar8;
  char *pcVar9;
  long lVar10;
  int iVar12;
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  int iVar15;
  undefined1 auVar14 [16];
  
  pwVar6 = *it;
  if (0 < *(long *)(this + 0x10)) {
    pcVar9 = *(char **)(this + 8);
    uVar8 = *(long *)(this + 0x10) + 1;
    do {
      *pwVar6 = (int)*pcVar9;
      pcVar9 = pcVar9 + 1;
      pwVar6 = pwVar6 + 1;
      uVar8 = uVar8 - 1;
    } while (1 < uVar8);
  }
  auVar5 = _DAT_001b7520;
  auVar4 = _DAT_001b4910;
  auVar3 = _DAT_001af040;
  lVar2 = *(long *)(this + 0x20);
  pwVar7 = pwVar6;
  if (lVar2 != 0) {
    pwVar7 = pwVar6 + lVar2;
    wVar1 = *(wchar_t *)(this + 0x18);
    uVar8 = lVar2 + 0x3fffffffffffffffU & 0x3fffffffffffffff;
    auVar11._8_4_ = (int)uVar8;
    auVar11._0_8_ = uVar8;
    auVar11._12_4_ = (int)(uVar8 >> 0x20);
    lVar10 = 0;
    auVar11 = auVar11 ^ _DAT_001af040;
    do {
      auVar13._8_4_ = (int)lVar10;
      auVar13._0_8_ = lVar10;
      auVar13._12_4_ = (int)((ulong)lVar10 >> 0x20);
      auVar14 = (auVar13 | auVar4) ^ auVar3;
      iVar12 = auVar11._4_4_;
      if ((bool)(~(auVar14._4_4_ == iVar12 && auVar11._0_4_ < auVar14._0_4_ ||
                  iVar12 < auVar14._4_4_) & 1)) {
        pwVar6[lVar10] = wVar1;
      }
      if ((auVar14._12_4_ != auVar11._12_4_ || auVar14._8_4_ <= auVar11._8_4_) &&
          auVar14._12_4_ <= auVar11._12_4_) {
        pwVar6[lVar10 + 1] = wVar1;
      }
      auVar13 = (auVar13 | auVar5) ^ auVar3;
      iVar15 = auVar13._4_4_;
      if (iVar15 <= iVar12 && (iVar15 != iVar12 || auVar13._0_4_ <= auVar11._0_4_)) {
        pwVar6[lVar10 + 2] = wVar1;
        pwVar6[lVar10 + 3] = wVar1;
      }
      lVar10 = lVar10 + 4;
    } while ((uVar8 - ((uint)(lVar2 + 0x3fffffffffffffffU) & 3)) + 4 != lVar10);
  }
  *it = pwVar7;
  int_writer<unsigned_int,fmt::v6::basic_format_specs<wchar_t>>::dec_writer::operator()
            ((dec_writer *)(this + 0x28),it);
  return;
}

Assistant:

FMT_CONSTEXPR size_t size() const { return size_; }